

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suggest_piece.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::suggest_piece::add_piece
          (suggest_piece *this,piece_index_t index,int availability,int max_queue_size)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_88;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_80;
  const_iterator local_78;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_70;
  const_iterator local_68;
  int local_5c;
  iterator iStack_58;
  int to_remove;
  const_iterator local_50;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_48;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_40;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_38;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_30;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  it;
  int mean;
  int max_queue_size_local;
  int availability_local;
  suggest_piece *this_local;
  piece_index_t index_local;
  
  this_local._4_4_ = index.m_val;
  it._M_current._4_4_ = sliding_average<int,_30>::mean(&this->m_availability);
  sliding_average<int,_30>::add_sample(&this->m_availability,availability);
  if (availability <= it._M_current._4_4_) {
    local_38._M_current =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::begin((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                  *)this);
    local_40 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ::std::
               vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               ::end((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                      *)this);
    local_30 = ::std::
               find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                         (local_38,(__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                    )local_40,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                          ((long)&this_local + 4));
    local_48._M_current =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::end((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                *)this);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
      ::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                  *)&local_50,&local_30);
      iStack_58 = ::std::
                  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                  ::erase((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                           *)this,local_50);
    }
    sVar2 = ::std::
            vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ::size((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    *)this);
    if (max_queue_size <= (int)sVar2) {
      sVar2 = ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::size((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                      *)this);
      local_5c = ((int)sVar2 - max_queue_size) + 1;
      local_70._M_current =
           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
           ::std::
           vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ::begin((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    *)this);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
      ::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                  *)&local_68,&local_70);
      local_88._M_current =
           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
           ::std::
           vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ::begin((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    *)this);
      local_80 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                 ::operator+(&local_88,(long)local_5c);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
      ::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                  *)&local_78,&local_80);
      ::std::
      vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ::erase((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               *)this,local_68,local_78);
    }
    ::std::
    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::push_back((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 *)this,(value_type *)((long)&this_local + 4));
  }
  return;
}

Assistant:

void add_piece(piece_index_t const index, int const availability
		, int const max_queue_size)
	{
		// keep a running average of the availability of pieces, and filter
		// anything above average.
		int const mean = m_availability.mean();
		m_availability.add_sample(availability);

		if (availability > mean) return;

		auto const it = std::find(m_priority_pieces.begin()
			, m_priority_pieces.end(), index);

		if (it != m_priority_pieces.end())
		{
			// increase the priority of this piece by moving it to the front
			// of the queue
			m_priority_pieces.erase(it);
		}

		if (int(m_priority_pieces.size()) >= max_queue_size)
		{
			int const to_remove = int(m_priority_pieces.size()) - max_queue_size + 1;
			m_priority_pieces.erase(m_priority_pieces.begin()
				, m_priority_pieces.begin() + to_remove);
		}

		m_priority_pieces.push_back(index);
	}